

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriter::WriteMemory(BinaryWriter *this,Memory *memory)

{
  Stream *stream;
  uint8_t value;
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  bool custom_page_size;
  uint32_t flags;
  Memory *memory_local;
  BinaryWriter *this_local;
  
  uVar1 = ComputeLimitsFlags(&memory->page_limits);
  bVar3 = memory->page_size != 0x10000;
  uVar2 = 0;
  if (bVar3) {
    uVar2 = 8;
  }
  WriteLimitsFlags(this->stream_,uVar2 | uVar1);
  WriteLimitsData(this->stream_,&memory->page_limits);
  if (bVar3) {
    stream = this->stream_;
    value = log2_u32(memory->page_size);
    WriteU32Leb128<unsigned_char>(stream,value,"memory page size");
  }
  return;
}

Assistant:

void BinaryWriter::WriteMemory(const Memory* memory) {
  uint32_t flags = ComputeLimitsFlags(&memory->page_limits);
  const bool custom_page_size = memory->page_size != WABT_DEFAULT_PAGE_SIZE;
  flags |= custom_page_size ? WABT_BINARY_LIMITS_HAS_CUSTOM_PAGE_SIZE_FLAG : 0;
  WriteLimitsFlags(stream_, flags);
  WriteLimitsData(stream_, &memory->page_limits);
  if (custom_page_size) {
    WriteU32Leb128(stream_, log2_u32(memory->page_size), "memory page size");
  }
}